

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

string __thiscall mjs::operator+(mjs *this,string *l,string *r)

{
  gc_heap *h;
  uint *puVar1;
  wstring *pwVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar3;
  ulong uVar4;
  string sVar5;
  ulong *local_98;
  long local_90;
  ulong local_88 [2];
  ulong *local_78;
  long local_70;
  ulong local_68 [2];
  wchar_t *local_58;
  size_t local_50;
  long local_48 [2];
  wstring_view local_38;
  
  h = (l->super_gc_heap_ptr<mjs::gc_string>).super_gc_heap_ptr_untyped.heap_;
  puVar1 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)l);
  local_78 = local_68;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_78,puVar1 + 1,puVar1 + (ulong)*puVar1 + 1);
  puVar1 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)r);
  local_98 = local_88;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_98,puVar1 + 1,puVar1 + (ulong)*puVar1 + 1);
  uVar4 = 3;
  if (local_78 != local_68) {
    uVar4 = local_68[0];
  }
  if (uVar4 < (ulong)(local_90 + local_70)) {
    uVar4 = 3;
    if (local_98 != local_88) {
      uVar4 = local_88[0];
    }
    if ((ulong)(local_90 + local_70) <= uVar4) {
      pwVar2 = (wstring *)
               std::__cxx11::wstring::replace((ulong)&local_98,0,(wchar_t *)0x0,(ulong)local_78);
      goto LAB_00127f0b;
    }
  }
  pwVar2 = (wstring *)std::__cxx11::wstring::_M_append((wchar_t *)&local_78,(ulong)local_98);
LAB_00127f0b:
  std::__cxx11::wstring::wstring((wstring *)&local_58,pwVar2);
  local_38._M_len = local_50;
  local_38._M_str = local_58;
  string::string((string *)this,h,&local_38);
  uVar3 = extraout_RDX;
  if (local_58 != (wchar_t *)local_48) {
    operator_delete(local_58,local_48[0] * 4 + 4);
    uVar3 = extraout_RDX_00;
  }
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] * 4 + 4);
    uVar3 = extraout_RDX_01;
  }
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] * 4 + 4);
    uVar3 = extraout_RDX_02;
  }
  sVar5.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped._8_8_ = uVar3;
  sVar5.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (string)sVar5.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped;
}

Assistant:

inline string operator+(const string& l, const string& r) {
    // TODO: Optimize this
    return string{l.heap(), std::wstring{l.view()} + std::wstring{r.view()}};
}